

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void InitEXRImage(EXRImage *exr_image)

{
  EXRImage *exr_image_local;
  
  if (exr_image != (EXRImage *)0x0) {
    exr_image->width = 0;
    exr_image->height = 0;
    exr_image->num_channels = 0;
    exr_image->images = (uchar **)0x0;
    exr_image->tiles = (EXRTile *)0x0;
  }
  return;
}

Assistant:

void InitEXRImage(EXRImage *exr_image) {
  if (exr_image == NULL) {
    return;
  }

  exr_image->width = 0;
  exr_image->height = 0;
  exr_image->num_channels = 0;

  exr_image->images = NULL;
  exr_image->tiles = NULL;
}